

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

double __thiscall HModel::computePrObj(HModel *this)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  if ((long)this->numRow < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      iVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2];
      if (iVar1 < this->numCol) {
        dVar3 = dVar3 + (this->baseValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2] *
                        (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1];
      }
      lVar2 = lVar2 + 1;
    } while (this->numRow != lVar2);
  }
  if (0 < (long)this->numCol) {
    lVar2 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] != 0) {
        dVar3 = dVar3 + (this->workValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2] *
                        (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (this->numCol != lVar2);
  }
  return dVar3;
}

Assistant:

double HModel::computePrObj() {
    double prObj = 0;
    for (int row = 0; row < numRow; row++) {
      int var = basicIndex[row];
      if (var < numCol) prObj += baseValue[row]*colCost[var];
    }
    for (int col = 0; col < numCol; col++)
        if (nonbasicFlag[col]) prObj += workValue[col]*colCost[col];
    return prObj;
}